

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_4eaaf::IntrusiveListTest::TearDown(IntrusiveListTest *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_38;
  Message local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  IntrusiveListTest *this_local;
  
  local_24 = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_20,"0",(int *)"TestObject::creation_count",&local_24,
             &(anonymous_namespace)::TestObject::creation_count);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
               ,0x4c,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

virtual void TearDown() { ASSERT_EQ(0, TestObject::creation_count); }